

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

MAP_RESULT Map_Delete(MAP_HANDLE handle,char *key)

{
  LOGGER_LOG p_Var1;
  char **ppcVar2;
  MAP_RESULT MVar3;
  long lVar4;
  
  if (handle == (MAP_HANDLE)0x0 || key == (char *)0x0) {
    p_Var1 = xlogging_get_log_function();
    MVar3 = MAP_INVALIDARG;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/map.c"
                ,"Map_Delete",0x1d5,1,"result = %s%s (%d)","",MAP_RESULTStringStorage[3],3);
    }
  }
  else {
    ppcVar2 = findKey(handle,key);
    if (ppcVar2 == (char **)0x0) {
      MVar3 = MAP_KEYNOTFOUND;
    }
    else {
      lVar4 = (long)ppcVar2 - (long)handle->keys;
      free(*ppcVar2);
      free(*(void **)((long)handle->values + lVar4));
      memmove((void *)((long)handle->keys + lVar4),(void *)((long)handle->keys + lVar4 + 8),
              (handle->count + ~(lVar4 >> 3)) * 8);
      memmove((void *)((long)handle->values + lVar4),(void *)((long)handle->values + lVar4 + 8),
              (~(lVar4 >> 3) + handle->count) * 8);
      Map_DecreaseStorageKeysValues(handle);
      MVar3 = MAP_OK;
    }
  }
  return MVar3;
}

Assistant:

MAP_RESULT Map_Delete(MAP_HANDLE handle, const char* key)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_020: [If parameter handle is NULL then Map_Delete shall return MAP_INVALIDARG.]*/
    /*Codes_SRS_MAP_02_021: [If parameter key is NULL then Map_Delete shall return MAP_INVALIDARG.]*/
    if (
        (handle == NULL) ||
        (key == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        MAP_HANDLE_DATA* handleData = (MAP_HANDLE_DATA*)handle;
        char** whereIsIt = findKey(handleData,key);
        if (whereIsIt == NULL)
        {
            /*Codes_SRS_MAP_02_022: [If key does not exist then Map_Delete shall return MAP_KEYNOTFOUND.]*/
            result = MAP_KEYNOTFOUND;
        }
        else
        {
            /*Codes_SRS_MAP_02_023: [Otherwise, Map_Delete shall remove the key and its associated value from the map and return MAP_OK.]*/
            size_t index = whereIsIt - handleData->keys;
            free(handleData->keys[index]);
            free(handleData->values[index]);
            memmove(handleData->keys + index, handleData->keys + index + 1, (handleData->count - index - 1)*sizeof(char*)); /*if order doesn't matter... then this can be optimized*/
            memmove(handleData->values + index, handleData->values + index + 1, (handleData->count - index - 1)*sizeof(char*));
            Map_DecreaseStorageKeysValues(handleData);
            result = MAP_OK;
        }

    }
    return result;
}